

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O1

void yajl_string_encode(yajl_print_t print,void *ctx,uchar *str,size_t len,int escape_solidus)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  char *__s;
  char *pcVar4;
  char *pcVar5;
  char local_40 [5];
  char local_3b;
  undefined1 local_3a;
  char *local_38;
  
  builtin_strncpy(local_40,"\\u00",4);
  local_3a = 0;
  if (len == 0) {
    pcVar5 = (char *)0x0;
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)0x0;
    local_38 = "\\/";
    if (escape_solidus == 0) {
      local_38 = pcVar4;
    }
    pcVar5 = (char *)0x0;
    do {
      bVar1 = str[(long)pcVar4];
      uVar3 = (uint)bVar1;
      if (bVar1 < 0x22) {
        __s = "\\r";
        switch(bVar1) {
        case 8:
          __s = "\\b";
          break;
        case 9:
          __s = "\\t";
          break;
        case 10:
          __s = "\\n";
          break;
        default:
switchD_0010493b_caseD_b:
          if (bVar1 < 0x20) {
            local_40[4] = "0123456789ABCDEF"[bVar1 >> 4];
            local_3b = "0123456789ABCDEF"[uVar3 & 0xf];
            __s = local_40;
          }
          else {
            __s = (char *)0x0;
          }
          break;
        case 0xc:
          __s = "\\f";
          break;
        case 0xd:
          break;
        }
      }
      else if (bVar1 == 0x22) {
        __s = "\\\"";
      }
      else {
        __s = local_38;
        if (uVar3 != 0x2f) {
          if (uVar3 != 0x5c) goto switchD_0010493b_caseD_b;
          __s = "\\\\";
        }
      }
      if (__s != (char *)0x0) {
        (*print)(ctx,(char *)(str + (long)pcVar5),(long)pcVar4 - (long)pcVar5);
        sVar2 = strlen(__s);
        (*print)(ctx,__s,sVar2 & 0xffffffff);
        pcVar5 = pcVar4 + 1;
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < len);
  }
  (*print)(ctx,(char *)(str + (long)pcVar5),(long)pcVar4 - (long)pcVar5);
  return;
}

Assistant:

void
yajl_string_encode(const yajl_print_t print,
                   void * ctx,
                   const unsigned char * str,
                   size_t len,
                   int escape_solidus)
{
    size_t beg = 0;
    size_t end = 0;
    char hexBuf[7];
    hexBuf[0] = '\\'; hexBuf[1] = 'u'; hexBuf[2] = '0'; hexBuf[3] = '0';
    hexBuf[6] = 0;

    while (end < len) {
        const char * escaped = NULL;
        switch (str[end]) {
            case '\r': escaped = "\\r"; break;
            case '\n': escaped = "\\n"; break;
            case '\\': escaped = "\\\\"; break;
            /* it is not required to escape a solidus in JSON:
             * read sec. 2.5: http://www.ietf.org/rfc/rfc4627.txt
             * specifically, this production from the grammar:
             *   unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
             */
            case '/': if (escape_solidus) escaped = "\\/"; break;
            case '"': escaped = "\\\""; break;
            case '\f': escaped = "\\f"; break;
            case '\b': escaped = "\\b"; break;
            case '\t': escaped = "\\t"; break;
            default:
                if ((unsigned char) str[end] < 32) {
                    CharToHex(str[end], hexBuf + 4);
                    escaped = hexBuf;
                }
                break;
        }
        if (escaped != NULL) {
            print(ctx, (const char *) (str + beg), end - beg);
            print(ctx, escaped, (unsigned int)strlen(escaped));
            beg = ++end;
        } else {
            ++end;
        }
    }
    print(ctx, (const char *) (str + beg), end - beg);
}